

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.y
# Opt level: O3

void __thiscall GrammarLexer::popFile(GrammarLexer *this)

{
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  mapped_type *ppbVar4;
  int4 filenum;
  int local_c;
  
  piVar2 = (this->filestack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->filestack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar1 = piVar3 + -1;
  (this->filestack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = piVar1;
  if (piVar2 == piVar1) {
    this->endoffile = true;
  }
  else {
    local_c = piVar3[-2];
    ppbVar4 = std::
              map<int,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::less<int>,_std::allocator<std::pair<const_int,_std::basic_istream<char,_std::char_traits<char>_>_*>_>_>
              ::operator[](&this->streammap,&local_c);
    this->in = *ppbVar4;
  }
  return;
}

Assistant:

void GrammarLexer::popFile(void)

{
  filestack.pop_back();
  if (filestack.empty()) {
    endoffile = true;
    return;
  }
  int4 filenum = filestack.back();
  in = streammap[filenum];	// Get previous stream
}